

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.cpp
# Opt level: O2

Error __thiscall
asmjit::_abi_1_10::ZoneStackBase::_prepareBlock
          (ZoneStackBase *this,uint32_t side,size_t initialIndex)

{
  Block *pBVar1;
  int line;
  Block *pBVar2;
  char *msg;
  void *pvVar3;
  
  if (this->_allocator == (ZoneAllocator *)0x0) {
    msg = "isInitialized()";
    line = 0x35;
  }
  else {
    pBVar1 = this->_block[side];
    if (pBVar1->_start != pBVar1->_end) {
      pBVar2 = (Block *)ZoneAllocator::alloc(this->_allocator,0x200);
      if (pBVar2 != (Block *)0x0) {
        pBVar2->_link[side] = (Block *)0x0;
        pBVar2->_link[side == 0] = pBVar1;
        pvVar3 = (void *)((long)pBVar2->_link + initialIndex);
        pBVar2->_start = pvVar3;
        pBVar2->_end = pvVar3;
        pBVar1->_link[side] = pBVar2;
        this->_block[side] = pBVar2;
      }
      return (uint)(pBVar2 == (Block *)0x0);
    }
    msg = "!prev->empty()";
    line = 0x38;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/core/zonestack.cpp"
             ,line,msg);
}

Assistant:

Error ZoneStackBase::_prepareBlock(uint32_t side, size_t initialIndex) noexcept {
  ASMJIT_ASSERT(isInitialized());

  Block* prev = _block[side];
  ASMJIT_ASSERT(!prev->empty());

  Block* block = _allocator->allocT<Block>(kBlockSize);
  if (ASMJIT_UNLIKELY(!block))
    return DebugUtils::errored(kErrorOutOfMemory);

  block->_link[ side] = nullptr;
  block->_link[!side] = prev;
  block->_start = (uint8_t*)block + initialIndex;
  block->_end = (uint8_t*)block + initialIndex;

  prev->_link[side] = block;
  _block[side] = block;

  return kErrorOk;
}